

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

uint16_t __thiscall capnp::DynamicEnum::asImpl(DynamicEnum *this,uint64_t requestedTypeId)

{
  uint64_t uVar1;
  Fault local_50;
  Fault f;
  uint64_t requestedTypeId_local;
  DynamicEnum *this_local;
  
  Schema::getProto((Reader *)&f,(Schema *)this);
  uVar1 = capnp::schema::Node::Reader::getId((Reader *)&f);
  if (requestedTypeId != uVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x78,FAILED,"requestedTypeId == schema.getProto().getId()",
               "\"Type mismatch in DynamicEnum.as().\"",
               (char (*) [35])"Type mismatch in DynamicEnum.as().");
    kj::_::Debug::Fault::~Fault(&local_50);
  }
  return this->value;
}

Assistant:

uint16_t DynamicEnum::asImpl(uint64_t requestedTypeId) const {
  KJ_REQUIRE(requestedTypeId == schema.getProto().getId(),
             "Type mismatch in DynamicEnum.as().") {
    // use it anyway
    break;
  }
  return value;
}